

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

undefined4 __thiscall
despot::RockSampleMMAPStateScenarioLowerBound::Value
          (RockSampleMMAPStateScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  State *state_00;
  bool bVar1;
  int d;
  int iVar2;
  size_type sVar3;
  const_reference ppSVar4;
  reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  double dVar9;
  double dVar10;
  int local_c0;
  int iStack_bc;
  Coord rock_pos;
  int local_b4;
  int rock_1;
  int r_1;
  double discount;
  double value;
  int local_98;
  ACT_TYPE action;
  int rock;
  int r;
  State *particle;
  double dStack_78;
  int i;
  double total_weight;
  Coord rob_pos;
  int state;
  allocator<double> local_51;
  undefined1 local_50 [8];
  vector<double,_std::allocator<double>_> expected_sampling_value;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  RockSampleMMAPStateScenarioLowerBound *this_local;
  
  iVar2 = this->rs_model_->num_rocks_;
  expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)history;
  std::allocator<double>::allocator(&local_51);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_50,(long)iVar2,&local_51);
  std::allocator<double>::~allocator(&local_51);
  _rob_pos = 0;
  despot::Coord::Coord((Coord *)&total_weight,-1,-1);
  dStack_78 = 0.0;
  for (particle._4_4_ = 0;
      sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles),
      (ulong)(long)particle._4_4_ < sVar3; particle._4_4_ = particle._4_4_ + 1) {
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)particle._4_4_);
    state_00 = *ppSVar4;
    iVar2 = this->rs_model_->num_rocks_;
    _rob_pos = BaseRockSample::GetRobPosIndex(this->rs_model_,state_00);
    _rob_pos = (1 << ((byte)iVar2 & 0x1f)) * _rob_pos;
    total_weight = (double)BaseRockSample::GetRobPos(this->rs_model_,state_00);
    for (action = 0; action < this->rs_model_->num_rocks_; action = action + 1) {
      dVar10 = *(double *)(state_00 + 0x18);
      bVar1 = CheckFlag(*(int *)(state_00 + 0xc),action);
      iVar2 = -10;
      if (bVar1) {
        iVar2 = 10;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_50,(long)action);
      *pvVar5 = dVar10 * (double)iVar2 + *pvVar5;
    }
    dStack_78 = *(double *)(state_00 + 0x18) + dStack_78;
  }
  for (local_98 = 0; local_98 < this->rs_model_->num_rocks_; local_98 = local_98 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_50,(long)local_98);
    if (0.0 < *pvVar5 / dStack_78) {
      SetFlag((int *)&rob_pos,local_98);
    }
  }
  value._4_4_ = -1;
  discount = 0.0;
  _rock_1 = 1.0;
  local_b4 = 0;
  while( true ) {
    pvVar6 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->rock_order_,(long)_rob_pos);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
    if (sVar3 <= (ulong)(long)local_b4) break;
    pvVar6 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->rock_order_,(long)_rob_pos);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_b4);
    iVar2 = *pvVar7;
    pvVar8 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&this->rs_model_->rock_pos_,(long)iVar2);
    dVar10 = *(double *)pvVar8;
    if (value._4_4_ == -1) {
      local_c0 = SUB84(dVar10,0);
      if (local_c0 < total_weight._0_4_) {
        value._4_4_ = 3;
      }
      else if (total_weight._0_4_ < local_c0) {
        value._4_4_ = 1;
      }
      else {
        iStack_bc = (int)((ulong)dVar10 >> 0x20);
        if (iStack_bc < total_weight._4_4_) {
          value._4_4_ = 2;
        }
        else if (total_weight._4_4_ < iStack_bc) {
          value._4_4_ = 0;
        }
        else {
          value._4_4_ = 4;
        }
      }
    }
    d = despot::Coord::ManhattanDistance(dVar10,total_weight);
    dVar9 = Globals::Discount(d);
    _rock_1 = dVar9 * _rock_1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_50,(long)iVar2);
    discount = _rock_1 * *pvVar5 + discount;
    local_b4 = local_b4 + 1;
    total_weight = dVar10;
  }
  if (value._4_4_ == -1) {
    value._4_4_ = 1;
  }
  iVar2 = Grid<int>::xsize(this->grid_);
  dVar10 = Globals::Discount(iVar2 - total_weight._0_4_);
  despot::ValuedAction::ValuedAction
            ((ValuedAction *)&this_local,value._4_4_,dStack_78 * 10.0 * _rock_1 * dVar10 + discount)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_50);
  return this_local._0_4_;
}

Assistant:

ValuedAction Value(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		vector<double> expected_sampling_value = vector<double>(
			rs_model_->num_rocks_);
		int state = 0;
		Coord rob_pos(-1, -1);
		double total_weight = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			state = (1 << rs_model_->num_rocks_)
				* rs_model_->GetRobPosIndex(particle);
			rob_pos = rs_model_->GetRobPos(particle);
			for (int r = 0; r < rs_model_->num_rocks_; r++) {
				expected_sampling_value[r] += particle->weight
					* (CheckFlag(particle->state_id, r) ? 10 : -10);
			}
			total_weight += particle->weight;
		}

		for (int rock = 0; rock < rs_model_->num_rocks_; rock++)
			if (expected_sampling_value[rock] / total_weight > 0.0)
				SetFlag(state, rock);

		ACT_TYPE action = -1;
		double value = 0;
		double discount = 1.0;
		for (int r = 0; r < rock_order_[state].size(); r++) {
			int rock = rock_order_[state][r];
			Coord rock_pos = rs_model_->rock_pos_[rock];

			if (action == -1) {
				if (rock_pos.x < rob_pos.x)
					action = Compass::WEST;
				else if (rock_pos.x > rob_pos.x)
					action = Compass::EAST;
				else if (rock_pos.y < rob_pos.y)
					action = Compass::SOUTH;
				else if (rock_pos.y > rob_pos.y)
					action = Compass::NORTH;
				else
					action = rs_model_->E_SAMPLE;
			}

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * expected_sampling_value[rock];
			rob_pos = rock_pos;
		}

		if (action == -1)
			action = Compass::EAST;

		value += 10 * total_weight * discount
			* Globals::Discount(grid_.xsize() - rob_pos.x);

		return ValuedAction(action, value);
	}